

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_typed_array_get_length_internal(JSContext *ctx,JSValue obj)

{
  JSObject *pJVar1;
  uint32_t uVar2;
  
  pJVar1 = get_typed_array(ctx,obj,0);
  uVar2 = 0xffffffff;
  if (pJVar1 != (JSObject *)0x0) {
    if (*(char *)((long)&((((pJVar1->u).map_iterator_data)->cur_record->hash_link).next)->prev + 4)
        == '\0') {
      uVar2 = (pJVar1->u).array.count;
    }
    else {
      JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    }
  }
  return uVar2;
}

Assistant:

static int js_typed_array_get_length_internal(JSContext *ctx,
                                              JSValueConst obj)
{
    JSObject *p;
    p = get_typed_array(ctx, obj, 0);
    if (!p)
        return -1;
    if (typed_array_is_detached(ctx, p)) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        return -1;
    }
    return p->u.array.count;
}